

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O3

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  rawSeq *prVar3;
  undefined8 *puVar4;
  BYTE *pBVar5;
  U32 minMatch;
  BYTE *pBVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar9;
  BYTE *pBVar10;
  ZSTD_dictMode_e dictMode;
  uint uVar11;
  uint uVar12;
  undefined8 *puVar13;
  undefined8 *puVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 *end;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
      dictMode = ZSTD_noDict;
    }
    else {
      dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
    }
  }
  minMatch = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar9 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar9;
  }
  uVar18 = rawSeqStore->pos;
  uVar19 = rawSeqStore->size;
  if (uVar19 < uVar18) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x2ad,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < uVar19) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x2ae,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  puVar2 = (undefined8 *)((long)src + srcSize);
  if (0 < (long)srcSize && uVar18 < uVar19) {
    puVar1 = puVar2 + -4;
    end = (undefined8 *)src;
    do {
      prVar3 = rawSeqStore->seq + uVar18;
      uVar19._0_4_ = prVar3->offset;
      uVar19._4_4_ = prVar3->litLength;
      if ((undefined4)uVar19 == 0) {
        __assert_fail("sequence.offset > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                      ,0x26f,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
      }
      uVar16 = uVar19 >> 0x20;
      uVar15 = rawSeqStore->seq[uVar18].matchLength;
      uVar12 = (uint)((long)puVar2 - (long)end);
      if (uVar12 < uVar15 + uVar19._4_4_) {
        ZSTD_ldm_skipSequences(rawSeqStore,(long)puVar2 - (long)end & 0xffffffff,minMatch);
        uVar18 = uVar19 & 0xffffffff;
        if (uVar12 - uVar19._4_4_ < minMatch) {
          uVar18 = 0;
        }
        uVar15 = uVar12 - uVar19._4_4_;
        src = end;
        if ((uVar12 < (uint)uVar19._4_4_ || uVar15 == 0) || (uVar19 = uVar18, uVar15 < minMatch))
        break;
      }
      else {
        rawSeqStore->pos = uVar18 + 1;
      }
      puVar4 = (undefined8 *)((long)end + uVar16);
      src = (void *)((long)puVar4 + (ulong)uVar15);
      if (puVar2 < src) {
        __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                      ,0x2b9,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                     );
      }
      uVar12 = (int)end - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar12) {
        uVar11 = (uVar12 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar11) {
          uVar11 = 0x200;
        }
        ms->nextToUpdate = uVar12 - uVar11;
      }
      ZSTD_ldm_fillFastTables(ms,end);
      sVar9 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,end,uVar16);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = (U32)uVar19;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar6 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar6 + sVar9) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (puVar2 < puVar4) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      puVar13 = (undefined8 *)((long)puVar4 - sVar9);
      if (puVar1 < puVar4) {
        pBVar10 = pBVar6;
        puVar14 = puVar13;
        if (puVar13 <= puVar1) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar6 + (-0x10 - (long)puVar13)) {
LAB_0081f579:
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          pBVar10 = pBVar6 + ((long)puVar1 - (long)puVar13);
          uVar8 = puVar13[1];
          *(undefined8 *)pBVar6 = *puVar13;
          *(undefined8 *)(pBVar6 + 8) = uVar8;
          puVar14 = puVar1;
          if (0x10 < (long)puVar1 - (long)puVar13) {
            lVar17 = 0x10;
            do {
              puVar13 = (undefined8 *)((long)end + lVar17 + (uVar16 - sVar9));
              uVar8 = puVar13[1];
              pBVar5 = pBVar6 + lVar17;
              *(undefined8 *)pBVar5 = *puVar13;
              *(undefined8 *)(pBVar5 + 8) = uVar8;
              puVar13 = (undefined8 *)((long)end + lVar17 + (uVar16 - sVar9) + 0x10);
              uVar8 = puVar13[1];
              *(undefined8 *)(pBVar5 + 0x10) = *puVar13;
              *(undefined8 *)(pBVar5 + 0x18) = uVar8;
              lVar17 = lVar17 + 0x20;
            } while (pBVar5 + 0x20 < pBVar10);
          }
        }
        if (puVar14 < puVar4) {
          lVar17 = 0;
          do {
            pBVar10[lVar17] = *(BYTE *)((long)puVar14 + lVar17);
            lVar17 = lVar17 + 1;
          } while ((long)puVar4 - (long)puVar14 != lVar17);
        }
LAB_0081f377:
        seqStore->lit = seqStore->lit + sVar9;
        if (0xffff < sVar9) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
      }
      else {
        uVar8 = puVar13[1];
        *(undefined8 *)pBVar6 = *puVar13;
        *(undefined8 *)(pBVar6 + 8) = uVar8;
        pBVar6 = seqStore->lit;
        if (0x10 < sVar9) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar6 + 0x10 + (-0x10 - (long)(puVar13 + 2)))
          goto LAB_0081f579;
          uVar8 = puVar13[3];
          *(undefined8 *)(pBVar6 + 0x10) = puVar13[2];
          *(undefined8 *)(pBVar6 + 0x18) = uVar8;
          if (0x20 < (long)sVar9) {
            lVar17 = 0;
            do {
              puVar4 = (undefined8 *)((long)end + lVar17 + (uVar16 - sVar9) + 0x20);
              uVar8 = puVar4[1];
              pBVar10 = pBVar6 + lVar17 + 0x20;
              *(undefined8 *)pBVar10 = *puVar4;
              *(undefined8 *)(pBVar10 + 8) = uVar8;
              puVar4 = (undefined8 *)((long)end + lVar17 + (uVar16 - sVar9) + 0x30);
              uVar8 = puVar4[1];
              *(undefined8 *)(pBVar10 + 0x10) = *puVar4;
              *(undefined8 *)(pBVar10 + 0x18) = uVar8;
              lVar17 = lVar17 + 0x20;
            } while (pBVar10 + 0x20 < pBVar6 + sVar9);
          }
          goto LAB_0081f377;
        }
        seqStore->lit = pBVar6 + sVar9;
      }
      psVar7 = seqStore->sequences;
      psVar7->litLength = (U16)sVar9;
      psVar7->offBase = (U32)uVar19 + 3;
      if (uVar15 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar18 = (ulong)uVar15 - 3;
      if (0xffff < uVar18) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->mlBase = (U16)uVar18;
      seqStore->sequences = psVar7 + 1;
      uVar18 = rawSeqStore->pos;
      if ((rawSeqStore->size <= uVar18) || (end = (undefined8 *)src, puVar2 <= src)) break;
    } while( true );
  }
  uVar15 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar15) {
    uVar12 = (uVar15 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar12) {
      uVar12 = 0x200;
    }
    ms->nextToUpdate = uVar15 - uVar12;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar9 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)puVar2 - (long)src);
  return sVar9;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}